

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
GenexEvaluator::EvaluateExpression
          (string *__return_storage_ptr__,GenexEvaluator *this,string *genexOperator,
          string *expression,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  cmGeneratorTarget *target;
  Result RVar1;
  cmGeneratorExpressionDAGChecker dagChecker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  cmGeneratorExpressionDAGChecker local_b0;
  
  if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (__return_storage_ptr__,expression,context->LG,context,(cmGeneratorTarget *)0x0,
               context->CurrentTarget,dagCheckerParent);
  }
  else {
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e0,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)context
              );
    target = context->HeadTarget;
    std::operator+(&local_100,genexOperator,":");
    std::operator+(&local_d0,&local_100,expression);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_b0,(cmListFileBacktrace *)&local_e0,target,&local_d0,content,dagCheckerParent)
    ;
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
    RVar1 = cmGeneratorExpressionDAGChecker::Check(&local_b0);
    if (RVar1 - SELF_REFERENCE < 2) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_100,content);
      cmGeneratorExpressionDAGChecker::ReportError(&local_b0,context,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      cmGeneratorExpressionNode::EvaluateDependentExpression
                (__return_storage_ptr__,expression,context->LG,context,context->HeadTarget,
                 context->CurrentTarget,&local_b0);
    }
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EvaluateExpression(
    const std::string& genexOperator, const std::string& expression,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const
  {
    if (context->HeadTarget) {
      cmGeneratorExpressionDAGChecker dagChecker(
        context->Backtrace, context->HeadTarget,
        genexOperator + ":" + expression, content, dagCheckerParent);
      switch (dagChecker.Check()) {
        case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE: {
          dagChecker.ReportError(context, content->GetOriginalExpression());
          return std::string();
        }
        case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        case cmGeneratorExpressionDAGChecker::DAG:
          break;
      }

      return this->EvaluateDependentExpression(
        expression, context->LG, context, context->HeadTarget,
        context->CurrentTarget, &dagChecker);
    }

    return this->EvaluateDependentExpression(
      expression, context->LG, context, context->HeadTarget,
      context->CurrentTarget, dagCheckerParent);
  }